

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::parametros_formais(Sintatico *this)

{
  bool bVar1;
  Sintatico *this_local;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0xc);
  if (bVar1) {
    eat(this,0xc);
    parametro_formal(this);
    while( true ) {
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x15);
      if (!bVar1) break;
      eat(this,0x15);
      parametro_formal(this);
    }
    eat(this,0xd);
  }
  else {
    eat(this,0x19);
  }
  return;
}

Assistant:

void Sintatico::parametros_formais() {
  if (isEqual(tok, ABREPAR)){
    eat(ABREPAR);
    parametro_formal();
    while (isEqual(tok, PONTOVIRGULA)) {
      eat(PONTOVIRGULA);
      parametro_formal();
    }
    eat(FECHAPAR);
  } else eat(ABREFECHAPAR);
}